

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O1

void __thiscall icu_63::RegexMatcher::RegexMatcher(RegexMatcher *this,RegexPattern *pat)

{
  UErrorCode *ctx;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__RegexMatcher_00475ca8;
  ctx = &this->fDeferredStatus;
  this->fDeferredStatus = U_ZERO_ERROR;
  init(this,(EVP_PKEY_CTX *)ctx);
  if (this->fDeferredStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    if (pat == (RegexPattern *)0x0) {
      *ctx = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      this->fPattern = pat;
      init2(this,*(UText **)(RegexStaticSets::gStaticSets + 0x5d8),ctx);
    }
  }
  return;
}

Assistant:

RegexMatcher::RegexMatcher(const RegexPattern *pat)  {
    fDeferredStatus = U_ZERO_ERROR;
    init(fDeferredStatus);
    if (U_FAILURE(fDeferredStatus)) {
        return;
    }
    if (pat==NULL) {
        fDeferredStatus = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    fPattern = pat;
    init2(RegexStaticSets::gStaticSets->fEmptyText, fDeferredStatus);
}